

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.cpp
# Opt level: O2

void __thiscall zmq::xpub_t::~xpub_t(xpub_t *this)

{
  ~xpub_t((xpub_t *)(this[-1].super_socket_base_t.super_own_t.options.curve_server_key + 0x18));
  return;
}

Assistant:

zmq::xpub_t::~xpub_t ()
{
    _welcome_msg.close ();
    for (std::deque<metadata_t *>::iterator it = _pending_metadata.begin (),
                                            end = _pending_metadata.end ();
         it != end; ++it)
        if (*it && (*it)->drop_ref ())
            LIBZMQ_DELETE (*it);
}